

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* OpticsParser::splitString
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  bool bVar1;
  istream *piVar2;
  undefined1 local_1d0 [8];
  string line;
  char token;
  istringstream local_1a0 [8];
  istringstream test;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::istringstream::istringstream(local_1a0,str,8);
  line.field_2._M_local_buf[0xb] = getSplitToken(str);
  std::__cxx11::string::string((string *)local_1d0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,(string *)local_1d0,line.field_2._M_local_buf[0xb]);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_1d0);
  }
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> splitString(const std::string & str)
    {
        std::vector<std::string> tokens;
        std::istringstream test{str};
        char token = getSplitToken(str);
        std::string line;
        while(std::getline(test, line, token))
        {
            tokens.push_back(line);
        }

        return tokens;
    }